

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_systemv.cpp
# Opt level: O3

bool __thiscall
QSharedMemorySystemV::attach(QSharedMemorySystemV *this,QSharedMemoryPrivate *self,AccessMode mode)

{
  int iVar1;
  void *pvVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QLatin1StringView function;
  QLatin1StringView function_00;
  QLatin1StringView function_01;
  shmid_ds shmid_ds;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = shmget(this->unix_key,0,(mode != ReadOnly | 2) << 7);
  if (iVar1 == -1) {
    function_00.m_data = "QSharedMemory::attach (shmget)";
    function_00.m_size = 0x1e;
    QSharedMemoryPrivate::setUnixErrorString(self,function_00);
    this->unix_key = 0;
    QByteArray::clear(&this->nativeKeyFile);
  }
  else {
    pvVar2 = shmat(iVar1,(void *)0x0,(uint)(mode == ReadOnly) << 0xc);
    self->memory = pvVar2;
    if (pvVar2 != (void *)0xffffffffffffffff) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      iVar1 = shmctl(iVar1,2,(shmid_ds *)&local_98);
      bVar3 = iVar1 == 0;
      if (bVar3) {
        self->size = (qsizetype)local_68;
      }
      else {
        function.m_data = "QSharedMemory::attach (shmctl)";
        function.m_size = 0x1e;
        QSharedMemoryPrivate::setUnixErrorString(self,function);
      }
      goto LAB_0049a50f;
    }
    self->memory = (void *)0x0;
    function_01.m_data = "QSharedMemory::attach (shmat)";
    function_01.m_size = 0x1d;
    QSharedMemoryPrivate::setUnixErrorString(self,function_01);
  }
  bVar3 = false;
LAB_0049a50f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QSharedMemorySystemV::attach(QSharedMemoryPrivate *self, QSharedMemory::AccessMode mode)
{
    // grab the shared memory segment id
    int id = shmget(unix_key, 0, (mode == QSharedMemory::ReadOnly ? 0400 : 0600));
    if (-1 == id) {
        self->setUnixErrorString("QSharedMemory::attach (shmget)"_L1);
        unix_key = 0;
        nativeKeyFile.clear();
        return false;
    }

    // grab the memory
    self->memory = shmat(id, nullptr, (mode == QSharedMemory::ReadOnly ? SHM_RDONLY : 0));
    if (self->memory == MAP_FAILED) {
        self->memory = nullptr;
        self->setUnixErrorString("QSharedMemory::attach (shmat)"_L1);
        return false;
    }

    // grab the size
    shmid_ds shmid_ds;
    if (!shmctl(id, IPC_STAT, &shmid_ds)) {
        self->size = (qsizetype)shmid_ds.shm_segsz;
    } else {
        self->setUnixErrorString("QSharedMemory::attach (shmctl)"_L1);
        return false;
    }

    return true;
}